

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O0

void __thiscall NaPNConstGen::set_const_value(NaPNConstGen *this,NaReal *fConst)

{
  undefined4 *puVar1;
  long in_RSI;
  long in_RDI;
  uint i;
  uint local_14;
  
  if (in_RSI == 0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 200); local_14 = local_14 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0xd0) + (ulong)local_14 * 8) =
         *(undefined8 *)(in_RSI + (ulong)local_14 * 8);
  }
  return;
}

Assistant:

void
NaPNConstGen::set_const_value (const NaReal* fConst)
{
    //!!!check_tunable();

    if(NULL == fConst)
        throw(na_null_pointer);

    unsigned    i;
    for(i = 0; i < nOutDim; ++i){
        fConstVal[i] = fConst[i];
    }
}